

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,REF_INT keep,REF_INT lose)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_ADJ ref_adj;
  REF_GLOB *pRVar3;
  REF_ADJ pRVar4;
  uint uVar5;
  undefined8 uVar6;
  REF_INT RVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  
  if (-1 < keep) {
    pRVar1 = ref_migrate->grid->node;
    if ((keep < pRVar1->max) && (pRVar2 = pRVar1->global, -1 < pRVar2[(uint)keep])) {
      if (((-1 < lose) && (lose < pRVar1->max)) && (-1 < pRVar2[(uint)lose])) {
        ref_adj = ref_migrate->conn;
        pRVar3 = ref_migrate->global;
        pRVar3[(uint)lose] = -1;
        pRVar4 = ref_migrate->parent_local;
        uVar10 = 0xffffffff;
        RVar7 = -1;
        if (keep < pRVar4->nnode) {
          uVar5 = pRVar4->first[(uint)keep];
          uVar10 = 0xffffffff;
          RVar7 = -1;
          if ((long)(int)uVar5 != -1) {
            RVar7 = pRVar4->item[(int)uVar5].ref;
            uVar10 = (ulong)uVar5;
          }
        }
        while ((int)uVar10 != -1) {
          lVar9 = pRVar2[(uint)lose];
          if (pRVar2[(uint)lose] < 0) {
            lVar9 = -1;
          }
          if (pRVar3[RVar7] == lVar9) {
            return 0;
          }
          uVar10 = (ulong)pRVar4->item[(int)uVar10].next;
          RVar7 = -1;
          if (uVar10 != 0xffffffffffffffff) {
            RVar7 = pRVar4->item[uVar10].ref;
          }
        }
        RVar7 = -1;
        uVar10 = 0xffffffff;
        if (lose < ref_adj->nnode) {
          uVar5 = ref_adj->first[(uint)lose];
          uVar10 = 0xffffffff;
          if ((long)(int)uVar5 != -1) {
            RVar7 = ref_adj->item[(int)uVar5].ref;
            uVar10 = (ulong)uVar5;
          }
        }
        do {
          if ((int)uVar10 == -1) {
            do {
              if ((ref_adj->nnode <= lose) || ((long)ref_adj->first[(uint)lose] == -1)) {
                if (ref_migrate->global[(uint)keep] == -1) {
                  return 0;
                }
                ref_migrate->xyz[(ulong)(uint)(keep * 3) + 1] = 0.5;
                ref_migrate->weight[(uint)keep] = 2.0;
                uVar5 = ref_adj_add(ref_migrate->parent_local,keep,lose);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0xda,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
                  return uVar5;
                }
                uVar5 = ref_adj_add(ref_migrate->parent_part,keep,pRVar1->part[(uint)lose]);
                if (uVar5 == 0) {
                  return 0;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0xdd,"ref_migrate_2d_agglomeration_keep",(ulong)uVar5,"add");
                return uVar5;
              }
              uVar5 = ref_adj_remove(ref_adj,lose,ref_adj->item[ref_adj->first[(uint)lose]].ref);
            } while (uVar5 == 0);
            uVar10 = (ulong)uVar5;
            pcVar8 = "rm from lose";
            uVar6 = 0xd1;
LAB_002002d8:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,uVar6,"ref_migrate_2d_agglomeration_keep",uVar10,pcVar8);
            return (REF_STATUS)uVar10;
          }
          uVar5 = ref_adj_remove(ref_adj,RVar7,lose);
          if (uVar5 != 0) {
            uVar10 = (ulong)uVar5;
            pcVar8 = "rm to lose";
            uVar6 = 0xc5;
            goto LAB_002002d8;
          }
          if (RVar7 != keep) {
            uVar5 = ref_adj_add_uniquely(ref_adj,RVar7,keep);
            if (uVar5 != 0) {
              uVar10 = (ulong)uVar5;
              pcVar8 = "add to keep";
              uVar6 = 199;
              goto LAB_002002d8;
            }
            uVar5 = ref_adj_add_uniquely(ref_adj,keep,RVar7);
            if (uVar5 != 0) {
              uVar10 = (ulong)uVar5;
              pcVar8 = "add to keep";
              uVar6 = 200;
              goto LAB_002002d8;
            }
          }
          uVar10 = (ulong)ref_adj->item[(int)uVar10].next;
          RVar7 = -1;
          if (uVar10 != 0xffffffffffffffff) {
            RVar7 = ref_adj->item[uVar10].ref;
          }
        } while( true );
      }
      pcVar8 = "lose node invalid";
      uVar6 = 0xb7;
      goto LAB_00200090;
    }
  }
  pcVar8 = "keep node invalid";
  uVar6 = 0xb6;
LAB_00200090:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar6,
         "ref_migrate_2d_agglomeration_keep",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration_keep(REF_MIGRATE ref_migrate,
                                                     REF_INT keep,
                                                     REF_INT lose) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_ADJ conn_adj = ref_migrate_conn(ref_migrate);
  REF_INT item, local;
  REF_GLOB global;
  REF_INT from_node;

  /* not working for general agglomeration, ghost lose? */

  RAS(ref_node_valid(ref_node, keep), "keep node invalid");
  RAS(ref_node_valid(ref_node, lose), "lose node invalid");

  ref_migrate_global(ref_migrate, lose) = REF_EMPTY;

  /* skip if the lose node has been agglomerated */
  each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), keep,
                                  item, local) {
    global = ref_migrate_global(ref_migrate, local);
    if (global == ref_node_global(ref_node, lose)) {
      return REF_SUCCESS;
    }
  }
  /* update edges pointing to lose node */
  each_ref_adj_node_item_with_ref(conn_adj, lose, item, from_node) {
    RSS(ref_adj_remove(conn_adj, from_node, lose), "rm to lose");
    if (from_node != keep) {
      RSS(ref_adj_add_uniquely(conn_adj, from_node, keep), "add to keep");
      RSS(ref_adj_add_uniquely(conn_adj, keep, from_node), "add to keep");
    }
  }

  /* update edges pointing from lose node */
  while (ref_adj_valid(ref_adj_first(conn_adj, lose))) {
    RSS(ref_adj_remove(
            conn_adj, lose,
            ref_adj_item_ref(conn_adj, ref_adj_first(conn_adj, lose))),
        "rm from lose");
  }

  /* skip if keep node is off-proc or already agglomerated */
  if (!ref_migrate_valid(ref_migrate, keep)) return REF_SUCCESS;

  ref_migrate_xyz(ref_migrate, 1, keep) = 0.5;
  ref_migrate_weight(ref_migrate, keep) = 2.0;
  /* collect age in general case */
  RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), keep, lose), "add");
  RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), keep,
                  ref_node_part(ref_node, lose)),
      "add");

  return REF_SUCCESS;
}